

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O0

knetFile * khttp_parse_url(char *fn,char *mode)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  char *pcVar5;
  bool bVar6;
  char *local_70;
  char *local_60;
  char *local_58;
  char *local_50;
  char *pcStack_40;
  int l;
  char *q;
  char *proxy;
  char *p;
  knetFile *fp;
  char *mode_local;
  char *fn_local;
  
  pcVar3 = strstr(fn,"http://");
  if (pcVar3 == fn) {
    proxy = fn + 7;
    while( true ) {
      bVar6 = false;
      if (*proxy != '\0') {
        bVar6 = *proxy != '/';
      }
      if (!bVar6) break;
      proxy = proxy + 1;
    }
    iVar1 = (int)proxy - (int)fn;
    iVar2 = iVar1 + -7;
    fn_local = (char *)calloc(1,0x80);
    pvVar4 = calloc((long)(iVar1 + -6),1);
    *(void **)(fn_local + 0x78) = pvVar4;
    strncpy(*(char **)(fn_local + 0x78),fn + 7,(long)iVar2);
    *(undefined1 *)(*(long *)(fn_local + 0x78) + (long)iVar2) = 0;
    pcStack_40 = *(char **)(fn_local + 0x78);
    while( true ) {
      bVar6 = false;
      if (*pcStack_40 != '\0') {
        bVar6 = *pcStack_40 != ':';
      }
      if (!bVar6) break;
      pcStack_40 = pcStack_40 + 1;
    }
    if (*pcStack_40 == ':') {
      *pcStack_40 = '\0';
      pcStack_40 = pcStack_40 + 1;
    }
    pcVar3 = getenv("http_proxy");
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strdup(*(char **)(fn_local + 0x78));
      *(char **)(fn_local + 0x10) = pcVar3;
      if (*pcStack_40 == '\0') {
        local_50 = "80";
      }
      else {
        local_50 = pcStack_40;
      }
      pcVar3 = strdup(local_50);
      *(char **)(fn_local + 0x18) = pcVar3;
      if (*proxy == '\0') {
        local_58 = "/";
      }
      else {
        local_58 = proxy;
      }
      pcVar3 = strdup(local_58);
      *(char **)(fn_local + 0x70) = pcVar3;
    }
    else {
      pcVar5 = strstr(pcVar3,"http://");
      if (pcVar5 == pcVar3) {
        local_60 = strdup(pcVar3 + 7);
      }
      else {
        local_60 = strdup(pcVar3);
      }
      *(char **)(fn_local + 0x10) = local_60;
      pcStack_40 = *(char **)(fn_local + 0x10);
      while( true ) {
        bVar6 = false;
        if (*pcStack_40 != '\0') {
          bVar6 = *pcStack_40 != ':';
        }
        if (!bVar6) break;
        pcStack_40 = pcStack_40 + 1;
      }
      if (*pcStack_40 == ':') {
        *pcStack_40 = '\0';
        pcStack_40 = pcStack_40 + 1;
      }
      if (*pcStack_40 == '\0') {
        local_70 = "80";
      }
      else {
        local_70 = pcStack_40;
      }
      pcVar3 = strdup(local_70);
      *(char **)(fn_local + 0x18) = pcVar3;
      pcVar3 = strdup(fn);
      *(char **)(fn_local + 0x70) = pcVar3;
    }
    fn_local[0] = '\x03';
    fn_local[1] = '\0';
    fn_local[2] = '\0';
    fn_local[3] = '\0';
    fn_local[4] = -1;
    fn_local[5] = -1;
    fn_local[6] = -1;
    fn_local[7] = -1;
    fn_local[0x20] = -1;
    fn_local[0x21] = -1;
    fn_local[0x22] = -1;
    fn_local[0x23] = -1;
    fn_local[0x60] = '\0';
    fn_local[0x61] = '\0';
    fn_local[0x62] = '\0';
    fn_local[99] = '\0';
    fn_local[100] = '\0';
    fn_local[0x65] = '\0';
    fn_local[0x66] = '\0';
    fn_local[0x67] = '\0';
  }
  else {
    fn_local = (char *)0x0;
  }
  return (knetFile *)fn_local;
}

Assistant:

knetFile *khttp_parse_url(const char *fn, const char *mode)
{
	knetFile *fp;
	char *p, *proxy, *q;
	int l;
	if (strstr(fn, "http://") != fn) return 0;
	// set ->http_host
	for (p = (char*)fn + 7; *p && *p != '/'; ++p);
	l = p - fn - 7;
	fp = (knetFile*)calloc(1, sizeof(knetFile));
	fp->http_host = (char*)calloc(l + 1, 1);
	strncpy(fp->http_host, fn + 7, l);
	fp->http_host[l] = 0;
	for (q = fp->http_host; *q && *q != ':'; ++q);
	if (*q == ':') *q++ = 0;
	// get http_proxy
	proxy = getenv("http_proxy");
	// set ->host, ->port and ->path
	if (proxy == 0) {
		fp->host = strdup(fp->http_host); // when there is no proxy, server name is identical to http_host name.
		fp->port = strdup(*q? q : "80");
		fp->path = strdup(*p? p : "/");
	} else {
		fp->host = (strstr(proxy, "http://") == proxy)? strdup(proxy + 7) : strdup(proxy);
		for (q = fp->host; *q && *q != ':'; ++q);
		if (*q == ':') *q++ = 0; 
		fp->port = strdup(*q? q : "80");
		fp->path = strdup(fn);
	}
	fp->type = KNF_TYPE_HTTP;
	fp->ctrl_fd = fp->fd = -1;
	fp->seek_offset = 0;
	return fp;
}